

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtMan.c
# Opt level: O2

Rwt_Man_t * Rwt_ManStart(int fPrecompute)

{
  abctime aVar1;
  Rwt_Man_t *p;
  char *pcVar2;
  Rwt_Node_t **ppRVar3;
  Mem_Fixed_t *pMVar4;
  Vec_Ptr_t *pVVar5;
  char **ppcVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  abctime aVar9;
  
  Abc_Clock();
  aVar1 = Abc_Clock();
  p = (Rwt_Man_t *)calloc(1,0x480);
  p->nFuncs = 0x10000;
  Rwt_ManGlobalStart();
  p->puCanons = s_puCanons;
  p->pPhases = s_pPhases;
  p->pPerms = s_pPerms;
  p->pMap = s_pMap;
  pcVar2 = Rwt_ManGetPractical(p);
  p->pPractical = pcVar2;
  ppRVar3 = (Rwt_Node_t **)calloc(1,(long)p->nFuncs << 3);
  p->pTable = ppRVar3;
  pMVar4 = Mem_FixedStart(0x28);
  p->pMmNode = pMVar4;
  pVVar5 = Vec_PtrAlloc(100);
  p->vForest = pVVar5;
  Rwt_ManAddVar(p,0,fPrecompute);
  Rwt_ManAddVar(p,0xaaaa,fPrecompute);
  Rwt_ManAddVar(p,0xcccc,fPrecompute);
  Rwt_ManAddVar(p,0xf0f0,fPrecompute);
  Rwt_ManAddVar(p,0xff00,fPrecompute);
  p->nClasses = 5;
  p->nTravIds = 1;
  ppcVar6 = Extra_Permutations(4);
  p->pPerms4 = ppcVar6;
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 0x32;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(200);
  pVVar7->pArray = piVar8;
  p->vLevNums = pVVar7;
  pVVar5 = Vec_PtrAlloc(0x32);
  p->vFanins = pVVar5;
  pVVar5 = Vec_PtrAlloc(0x32);
  p->vFaninsCur = pVVar5;
  pVVar5 = Vec_PtrAlloc(0x32);
  p->vNodesTemp = pVVar5;
  if (fPrecompute == 0) {
    Rwt_ManLoadFromArray(p,0);
    Rwt_ManPreprocess(p);
  }
  aVar9 = Abc_Clock();
  p->timeStart = aVar9 - aVar1;
  return p;
}

Assistant:

Rwt_Man_t * Rwt_ManStart( int fPrecompute )
{
    Rwt_Man_t * p;
    abctime clk = Abc_Clock();
clk = Abc_Clock();
    p = ABC_ALLOC( Rwt_Man_t, 1 );
    memset( p, 0, sizeof(Rwt_Man_t) );
    p->nFuncs = (1<<16);
    // copy the global tables
    Rwt_ManGlobalStart();
    p->puCanons = s_puCanons; 
    p->pPhases  = s_pPhases; 
    p->pPerms   = s_pPerms; 
    p->pMap     = s_pMap; 
    // initialize practical NPN classes
    p->pPractical  = Rwt_ManGetPractical( p );
    // create the table
    p->pTable = ABC_ALLOC( Rwt_Node_t *, p->nFuncs );
    memset( p->pTable, 0, sizeof(Rwt_Node_t *) * p->nFuncs );
    // create the elementary nodes
    p->pMmNode  = Mem_FixedStart( sizeof(Rwt_Node_t) );
    p->vForest  = Vec_PtrAlloc( 100 );
    Rwt_ManAddVar( p, 0x0000, fPrecompute ); // constant 0
    Rwt_ManAddVar( p, 0xAAAA, fPrecompute ); // var A
    Rwt_ManAddVar( p, 0xCCCC, fPrecompute ); // var B
    Rwt_ManAddVar( p, 0xF0F0, fPrecompute ); // var C
    Rwt_ManAddVar( p, 0xFF00, fPrecompute ); // var D
    p->nClasses = 5;
    // other stuff
    p->nTravIds   = 1;
    p->pPerms4    = Extra_Permutations( 4 );
    p->vLevNums   = Vec_IntAlloc( 50 );
    p->vFanins    = Vec_PtrAlloc( 50 );
    p->vFaninsCur = Vec_PtrAlloc( 50 );
    p->vNodesTemp = Vec_PtrAlloc( 50 );
    if ( fPrecompute )
    {   // precompute subgraphs
//        Rwt_ManPrecompute( p );
//        Rwt_ManPrint( p );
//        Rwt_ManWriteToArray( p );
    }
    else
    {   // load saved subgraphs
        Rwt_ManLoadFromArray( p, 0 );
//        Rwt_ManPrint( p );
        Rwt_ManPreprocess( p );
    }
p->timeStart = Abc_Clock() - clk;
    return p;
}